

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O0

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingWhiteOnBlackProducesGrayDependingOnCover
          (GenericRGBXBlenderTests *this)

{
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
  *this_00;
  allocator local_b1;
  string local_b0 [32];
  LocationInfo local_90;
  undefined8 local_68;
  pixel reference [7];
  pixel local_44;
  pixel dest [7];
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
  whiteness;
  uint8_t covers [7];
  pixel black;
  int n;
  GenericRGBXBlenderTests *this_local;
  
  stack0xffffffffffffffec = 7;
  covers[0] = '\0';
  covers[1] = '\0';
  covers[2] = '\0';
  covers[3] = '\0';
  whiteness._a._0_3_ = 0xfff081;
  whiteness._color.r = '\0';
  whiteness._color.g = '\x12';
  whiteness._color.b = '!';
  whiteness._color.a = 'q';
  dest[5].components = (uint8_t  [4])color::make(0xff,0xff,0xff,0xff);
  this_00 = (blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
             *)(dest + 6);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  blender_solid_color_rgb(this_00,(color)dest[5].components);
  std::
  fill_n<agge::tests::mocks::pixel_rgbx<agge::order_rgba>*,int,agge::tests::mocks::pixel_rgbx<agge::order_rgba>>
            (reference + 6,7,(pixel_rgbx<agge::order_rgba> *)covers);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,reference + 6,0,0,1,(cover_type *)&whiteness);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,&local_44,0,0,1,&whiteness._color.g);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest,0,0,1,&whiteness._color.b);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest + 1,0,0,1,&whiteness._color.a);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest + 2,0,0,1,(cover_type *)&whiteness._a);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest + 3,0,0,1,(cover_type *)((long)&whiteness._a + 1));
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(this_00,dest + 4,0,0,1,(cover_type *)((long)&whiteness._a + 2));
  reference[2].components[0] = 0x80;
  reference[2].components[1] = 0x80;
  reference[2].components[2] = 0x80;
  reference[2].components[3] = 0x80;
  reference[3].components[0] = 0xef;
  reference[3].components[1] = 0xef;
  reference[3].components[2] = 0xef;
  reference[3].components[3] = 0xef;
  reference[4].components[0] = 0xff;
  reference[4].components[1] = 0xff;
  reference[4].components[2] = 0xff;
  reference[4].components[3] = 0xff;
  local_68._0_1_ = '\0';
  local_68._1_1_ = '\0';
  local_68._2_1_ = '\0';
  local_68._3_1_ = '\0';
  local_68._4_1_ = '\x11';
  local_68._5_1_ = '\x11';
  local_68._6_1_ = '\x11';
  local_68._7_1_ = '\x11';
  builtin_memcpy(reference[0].components,"    ",4);
  builtin_memcpy(reference[1].components,"pppp",4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_b1);
  ut::LocationInfo::LocationInfo(&local_90,(string *)local_b0,0x3e);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,7ul>
            ((pixel_rgbx<agge::order_rgba> (*) [7])&local_68,
             (pixel_rgbx<agge::order_rgba> (*) [7])(reference + 6),&local_90);
  ut::LocationInfo::~LocationInfo(&local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  return;
}

Assistant:

test( BlendingWhiteOnBlackProducesGrayDependingOnCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel black = { };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> whiteness(color::make(0xFF, 0xFF, 0xFF));
				pixel dest[n];

				fill_n(dest, n, black);

				// ACT
				whiteness(dest + 0, 0, 0, 1, covers + 0);
				whiteness(dest + 1, 0, 0, 1, covers + 1);
				whiteness(dest + 2, 0, 0, 1, covers + 2);
				whiteness(dest + 3, 0, 0, 1, covers + 3);
				whiteness(dest + 4, 0, 0, 1, covers + 4);
				whiteness(dest + 5, 0, 0, 1, covers + 5);
				whiteness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0x00, 0x00, 0x00, 0x00 } },
					{ { 0x11, 0x11, 0x11, 0x11 } },
					{ { 0x20, 0x20, 0x20, 0x20 } },
					{ { 0x70, 0x70, 0x70, 0x70 } },
					{ { 0x80, 0x80, 0x80, 0x80 } },
					{ { 0xEF, 0xEF, 0xEF, 0xEF } },
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
				};

				assert_equal(reference, dest);
			}